

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

uint32 __thiscall Clasp::StatisticObject::size(StatisticObject *this)

{
  code *UNRECOVERED_JUMPTABLE;
  Type TVar1;
  uint32 uVar2;
  I *pIVar3;
  void *pvVar4;
  
  TVar1 = type(this);
  if (TVar1.val_ < Array) {
    return 0;
  }
  if (TVar1.val_ - Array < 2) {
    pIVar3 = tid(this);
    UNRECOVERED_JUMPTABLE = *(code **)(pIVar3 + 2);
    pvVar4 = self(this);
    uVar2 = (*UNRECOVERED_JUMPTABLE)(pvVar4);
    return uVar2;
  }
  Potassco::fail(-2,"uint32 Clasp::StatisticObject::size() const",0x42,"false","invalid object",0);
}

Assistant:

uint32 StatisticObject::size() const {
	switch (type()) {
		default: POTASSCO_REQUIRE(false, "invalid object");
		case Potassco::Statistics_t::Empty: return 0;
		case Potassco::Statistics_t::Value: return 0;
		case Potassco::Statistics_t::Map:   return static_cast<const M*>(tid())->size(self());
		case Potassco::Statistics_t::Array: return static_cast<const A*>(tid())->size(self());
	}
}